

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O1

LispPTR get_fn_fvar_name(fnhead *fnobj,DLword offset)

{
  uint uVar1;
  DLword *pDVar2;
  undefined6 in_register_00000032;
  
  uVar1 = *(uint *)(&fnobj->na + (byte)fnobj->field_0xc + fnobj->ntsize);
  pDVar2 = (DLword *)(&fnobj->na + (byte)fnobj->field_0xc);
  while (uVar1 != ((uint)CONCAT62(in_register_00000032,offset) | 0xc0000000)) {
    uVar1 = *(uint *)(pDVar2 + (ulong)fnobj->ntsize + 2);
    pDVar2 = pDVar2 + 2;
  }
  return *(LispPTR *)pDVar2;
}

Assistant:

LispPTR get_fn_fvar_name(struct fnhead *fnobj, DLword offset) {
  NAMETABLE *first_table;
  NAMETABLE *second_table;

  first_table = (NAMETABLE *)((DLword *)fnobj + fnobj->fvaroffset);
  second_table = (NAMETABLE *)((DLword *)first_table + fnobj->ntsize);
#ifdef BIGATOMS
  while (*(second_table) != (VTY_FVAR | offset))
#else
  while (GETWORD(second_table) != (VTY_FVAR | offset))
#endif /* BIGATOMS */

  {
    first_table++;
    second_table++;
  }
#ifdef BIGATOMS
  return ((LispPTR) * (first_table));
#else
  return ((LispPTR)GETWORD(first_table));
#endif /* BIGATOMS */

}